

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

ssize_t __thiscall
Server::Private::ClientImpl::read(ClientImpl *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  undefined8 uVar3;
  ulong uVar4;
  int in_R8D;
  ClientImpl *local_18;
  
  uVar3 = 0;
  sVar2 = Socket::recv(&this->super_Socket,__fd,__buf,0,in_R8D);
  if (sVar2 == 0) {
LAB_00113847:
    local_18 = this;
    HashSet<Server::Private::ClientImpl_*>::append(&this->_p->_closingClients,&local_18);
  }
  else {
    if (sVar2 != -1) {
      uVar4 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
      goto LAB_00113863;
    }
    iVar1 = Socket::getLastError();
    if (iVar1 != 0) goto LAB_00113847;
  }
  sVar2 = 0;
  uVar4 = 0;
LAB_00113863:
  *(ssize_t *)__nbytes = sVar2;
  return uVar4 & 0xffffffff;
}

Assistant:

bool Server::Private::ClientImpl::read(byte *buffer, usize maxSize, usize &size)
{
  ssize received = recv(buffer, maxSize);
  switch (received)
  {
  case -1:
    if (Socket::getLastError() == 0) // EWOULDBLOCK
    {
      size = 0;
      return false;
    }
    // no break
  case 0:
    _p._closingClients.append(this);
    size = 0;
    return false;
  default:
    break;
  }
  size = (usize)received;
  return true;
}